

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb__arrsize_(void **pp,int size,int limit,int len)

{
  void *pvVar1;
  undefined4 local_3c;
  void *local_38;
  void *p_1;
  stb__arr *a;
  void *p;
  int local_18;
  int len_local;
  int limit_local;
  int size_local;
  void **pp_local;
  
  pvVar1 = *pp;
  if (pvVar1 == (void *)0x0) {
    if ((len == 0) && (size == 0)) {
      return;
    }
    p_1 = stb__arr_malloc(size * limit + 0x10);
    *(int *)((long)p_1 + 4) = limit;
    *(int *)p_1 = len;
    *(uint *)((long)p_1 + 8) = (uint)(stb__arr_context != (void *)0x0);
    *(int *)((long)p_1 + 0xc) = 0x51bada7b;
  }
  else {
    p_1 = (void *)((long)pvVar1 + -0x10);
    *(int *)p_1 = len;
    if (*(int *)((long)pvVar1 + -0xc) < limit) {
      local_18 = limit;
      if ((3 < *(int *)((long)pvVar1 + -0xc)) &&
         (SBORROW4(limit,*(int *)((long)pvVar1 + -0xc) * 2) !=
          limit + *(int *)((long)pvVar1 + -0xc) * -2 < 0)) {
        local_18 = *(int *)((long)pvVar1 + -0xc) << 1;
      }
      if (*(int *)((long)pvVar1 + -8) == 0) {
        local_38 = realloc(p_1,(long)(local_18 * size) + 0x10);
      }
      else {
        local_38 = stb_realloc(p_1,(long)(local_18 * size) + 0x10);
      }
      if (local_38 != (void *)0x0) {
        p_1 = local_38;
        *(int *)((long)local_38 + 4) = local_18;
      }
    }
  }
  if (*p_1 < *(int *)((long)p_1 + 4)) {
    local_3c = *p_1;
  }
  else {
    local_3c = *(undefined4 *)((long)p_1 + 4);
  }
  *(undefined4 *)p_1 = local_3c;
  *pp = (void *)((long)p_1 + 0x10);
  return;
}

Assistant:

static void stb__arrsize_(void **pp, int size, int limit, int len  STB__PARAMS)
{
   void *p = *pp;
   stb__arr *a;
   stb_arr_check2(p);
   if (p == NULL) {
      if (len == 0 && size == 0) return;
      a = (stb__arr *) stb__arr_malloc(sizeof(*a) + size*limit);
      a->limit = limit;
      a->len   = len;
      a->stb_malloc = !!stb__arr_context;
      a->signature = stb_arr_signature;
   } else {
      a = stb_arrhead2(p);
      a->len = len;
      if (a->limit < limit) {
         void *p;
         if (a->limit >= 4 && limit < a->limit * 2)
            limit = a->limit * 2;
         if (a->stb_malloc)
            p = stb_realloc(a, sizeof(*a) + limit*size);
         else
            #ifdef STB_MALLOC_WRAPPER
            p = stb__realloc(a, sizeof(*a) + limit*size, file, line);
            #else
            p = realloc(a, sizeof(*a) + limit*size);
            #endif
         if (p) {
            a = (stb__arr *) p;
            a->limit = limit;
         } else {
            // throw an error!
         }
      }
   }
   a->len   = stb_min(a->len, a->limit);
   *pp = a+1;
}